

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O3

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,S64LEB x)

{
  pointer puVar1;
  bool bVar2;
  ostream *poVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ulong uVar4;
  LEB<long,_signed_char> local_38;
  S64LEB x_local;
  
  local_38.value = x.value;
  bVar2 = isDebugEnabled("binary");
  uVar4 = 0xffffffffffffffff;
  __buf = extraout_RDX;
  if (bVar2) {
    uVar4 = (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"writeS64LEB: ",0xd);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (at ",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    __buf = extraout_RDX_00;
  }
  LEB<long,_signed_char>::write(&local_38,(int)this,__buf,in_RCX);
  bVar2 = isDebugEnabled("binary");
  if ((bVar2) &&
     (uVar4 < (ulong)((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start))) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
      puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,(uint)puVar1[uVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (at ",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                  ).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
  }
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(S64LEB x) {
    [[maybe_unused]] size_t before = -1;
    BYN_DEBUG(before = size(); std::cerr << "writeS64LEB: " << x.value
                                         << " (at " << before << ")"
                                         << std::endl;);
    x.write(this);
    BYN_DEBUG(for (size_t i = before; i < size(); i++) {
      std::cerr << "  " << (int)at(i) << " (at " << i << ")\n";
    });
    return *this;
  }